

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  SyntaxNode *this_00;
  int iVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  size_t __n;
  Diagnostic *this_01;
  int *__s1;
  size_type __rlen;
  char *__s2;
  ulong uVar3;
  long lVar4;
  string_view arg;
  SourceRange SVar5;
  
  uVar3 = (pragma->args).elements._M_extent._M_extent_value + 1;
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    lVar4 = 0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((pragma->args).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar4));
      this_00 = *ppSVar2;
      if ((this_00->kind == SimplePragmaExpression) && ((short)this_00[1].kind == TokenList)) {
        arg = Token::rawText((Token *)(this_00 + 1));
        __s1 = (int *)arg._M_str;
        __n = arg._M_len;
        if ((long)__n < 7) {
          if (__n != 0) {
            if (__n == 4) {
              __s2 = "once";
              goto LAB_0028bf56;
            }
LAB_0028bf62:
            SVar5 = Token::range((Token *)(this_00 + 1));
            this_01 = addDiag(this,(DiagCode)0x2b0004,SVar5);
            Diagnostic::operator<<(this_01,arg);
            if (__n == 7) goto LAB_0028bf93;
          }
        }
        else if (__n == 10) {
          __s2 = "diagnostic";
LAB_0028bf56:
          iVar1 = bcmp(__s1,__s2,__n);
          if (iVar1 != 0) goto LAB_0028bf62;
        }
        else {
          if ((__n != 7) || (*(int *)((long)__s1 + 3) != 0x74636574 || *__s1 != 0x746f7270))
          goto LAB_0028bf62;
LAB_0028bf93:
          if (*(int *)((long)__s1 + 3) == 0x74636574 && *__s1 == 0x746f7270) {
            this->protectEncryptDepth = 0;
            this->protectDecryptDepth = 0;
            this->protectLineLength = 0;
            this->protectBytes = 0;
            this->protectEncoding = Raw;
          }
        }
      }
      else {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(this_00);
        addDiag(this,(DiagCode)0x90004,SVar5);
      }
      lVar4 = lVar4 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                std::string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}